

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRStereoNode.cpp
# Opt level: O3

VRDisplayNode *
MinVR::VRStereoNode::create(VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  VRAnyCoreType VVar5;
  undefined4 extraout_var;
  VRStereoNode *this;
  VRStereoFormat format;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  string formatStr;
  float local_114;
  string local_110;
  long *local_f0 [2];
  long local_e0 [2];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  paVar1 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"GraphicsToolkit","");
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + nameSpace->_M_string_length);
  VVar5 = VRDataIndex::getValue(config,&local_110,&local_50,true);
  (*(VVar5.datum)->_vptr_VRDatum[2])(local_f0,VVar5.datum);
  iVar3 = (*vrMain->_vptr_VRMainInterface[5])(vrMain,local_f0);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"StereoFormat","");
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + nameSpace->_M_string_length);
  VVar5 = VRDataIndex::getValue(config,&local_110,&local_70,true);
  (*(VVar5.datum)->_vptr_VRDatum[2])(local_f0,VVar5.datum);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  iVar4 = std::__cxx11::string::compare((char *)local_f0);
  if (iVar4 == 0) {
    local_110._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"EyeSeparation","");
    pcVar2 = (nameSpace->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + nameSpace->_M_string_length);
    VVar5 = VRDataIndex::getValue(config,&local_110,&local_90,true);
    (*(VVar5.datum)->_vptr_VRDatum[8])(VVar5.datum);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    format = VRSTEREOFORMAT_QUADBUFFERED;
    local_114 = extraout_XMM0_Da;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)local_f0);
    if (iVar4 == 0) {
      local_110._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"EyeSeparation","");
      pcVar2 = (nameSpace->_M_dataplus)._M_p;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar2,pcVar2 + nameSpace->_M_string_length);
      VVar5 = VRDataIndex::getValue(config,&local_110,&local_b0,true);
      (*(VVar5.datum)->_vptr_VRDatum[8])(VVar5.datum);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar1) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      format = VRSTEREOFORMAT_SIDEBYSIDE;
      local_114 = extraout_XMM0_Da_00;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)local_f0);
      if (iVar4 == 0) {
        local_110._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"EyeSeparation","");
        pcVar2 = (nameSpace->_M_dataplus)._M_p;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,pcVar2,pcVar2 + nameSpace->_M_string_length);
        VVar5 = VRDataIndex::getValue(config,&local_110,&local_d0,true);
        (*(VVar5.datum)->_vptr_VRDatum[8])(VVar5.datum);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != paVar1) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        format = VRSTEREOFORMAT_COLUMNINTERLACED;
        local_114 = extraout_XMM0_Da_01;
      }
      else {
        format = VRSTEREOFORMAT_MONO;
        local_114 = 0.0;
      }
    }
  }
  this = (VRStereoNode *)operator_new(0x80);
  VRStereoNode(this,nameSpace,local_114,(VRGraphicsToolkit *)CONCAT44(extraout_var,iVar3),format);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  return &this->super_VRDisplayNode;
}

Assistant:

VRDisplayNode* VRStereoNode::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace)
{

	VRGraphicsToolkit *gfxToolkit = vrMain->getGraphicsToolkit(config->getValue("GraphicsToolkit", nameSpace));
	float iod = 0.0f;
	std::string formatStr = config->getValue("StereoFormat", nameSpace);
	VRStereoNode::VRStereoFormat format = VRStereoNode::VRSTEREOFORMAT_MONO;
	if (formatStr == "QuadBuffered") {
		format = VRStereoNode::VRSTEREOFORMAT_QUADBUFFERED;
		iod = (float)config->getValue("EyeSeparation", nameSpace);
	}
	else if (formatStr == "SideBySide") {
		format = VRStereoNode::VRSTEREOFORMAT_SIDEBYSIDE;
		iod = (float)config->getValue("EyeSeparation", nameSpace);
	}
	else if (formatStr == "ColumnInterlaced") {
		format = VRStereoNode::VRSTEREOFORMAT_COLUMNINTERLACED;
		iod = (float)config->getValue("EyeSeparation", nameSpace);
	}

	VRDisplayNode *node = new VRStereoNode(nameSpace, iod, gfxToolkit, format);

	return node;
}